

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

void usage(void)

{
  int i;
  int local_4;
  
  fprintf(_stderr,"LuaJIT 2.1.0-beta3 VM builder.\n");
  fprintf(_stderr,"Copyright (C) 2005-2017 Mike Pall, http://luajit.org/\n");
  fprintf(_stderr,"Target architecture: x64\n\n");
  fprintf(_stderr,"Usage: buildvm -m mode [-o outfile] [infiles...]\n\n");
  fprintf(_stderr,"Available modes:\n");
  for (local_4 = 0; local_4 < 0xb; local_4 = local_4 + 1) {
    fprintf(_stderr,"  %s\n",modenames[local_4]);
  }
  exit(1);
}

Assistant:

static void usage(void)
{
  int i;
  fprintf(stderr, LUAJIT_VERSION " VM builder.\n");
  fprintf(stderr, LUAJIT_COPYRIGHT ", " LUAJIT_URL "\n");
  fprintf(stderr, "Target architecture: " LJ_ARCH_NAME "\n\n");
  fprintf(stderr, "Usage: buildvm -m mode [-o outfile] [infiles...]\n\n");
  fprintf(stderr, "Available modes:\n");
  for (i = 0; i < BUILD__MAX; i++)
    fprintf(stderr, "  %s\n", modenames[i]);
  exit(1);
}